

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

uint64_t __thiscall slang::ast::Type::getBitstreamWidth(Type *this)

{
  bitwidth_t bVar1;
  ClassType *this_00;
  uint64_t uVar2;
  Type *pTVar3;
  
  this_00 = (ClassType *)getCanonicalType(this);
  switch((this_00->super_Type).super_Symbol.kind) {
  case FixedSizeUnpackedArrayType:
    pTVar3 = (Type *)(this_00->super_Scope).firstMember;
    break;
  default:
    bVar1 = getBitWidth((Type *)this_00);
    pTVar3 = (Type *)(ulong)bVar1;
    break;
  case UnpackedStructType:
  case UnpackedUnionType:
    pTVar3 = this_00->baseClass;
    break;
  case ClassType:
    uVar2 = ClassType::getBitstreamWidth(this_00);
    return uVar2;
  }
  return (uint64_t)pTVar3;
}

Assistant:

uint64_t Type::getBitstreamWidth() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
            return ct.as<FixedSizeUnpackedArrayType>().bitstreamWidth;
        case SymbolKind::UnpackedStructType:
            return ct.as<UnpackedStructType>().bitstreamWidth;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().bitstreamWidth;
        case SymbolKind::ClassType:
            return ct.as<ClassType>().getBitstreamWidth();
        default:
            return ct.getBitWidth();
    }
}